

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

void uhash_removeAll_63(UHashtable *hash)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  UHashElement *e;
  long lVar5;
  
  if (hash->count == 0) {
    return;
  }
  iVar4 = -1;
  do {
    lVar2 = (long)iVar4;
    lVar1 = lVar2 * 0x18;
    iVar3 = iVar4;
    do {
      lVar5 = lVar1;
      lVar2 = lVar2 + 1;
      if (hash->length <= lVar2) {
        e = (UHashElement *)0x0;
        goto LAB_002af290;
      }
      iVar3 = iVar3 + 1;
      lVar1 = lVar5 + 0x18;
    } while (*(int *)((long)&hash->elements[1].hashcode + lVar5) < 0);
    e = (UHashElement *)((long)&hash->elements[1].hashcode + lVar5);
    iVar4 = iVar3;
LAB_002af290:
    if (e == (UHashElement *)0x0) {
      return;
    }
    uhash_removeElement_63(hash,e);
  } while( true );
}

Assistant:

U_CAPI void U_EXPORT2
uhash_removeAll(UHashtable *hash) {
    int32_t pos = UHASH_FIRST;
    const UHashElement *e;
    U_ASSERT(hash != NULL);
    if (hash->count != 0) {
        while ((e = uhash_nextElement(hash, &pos)) != NULL) {
            uhash_removeElement(hash, e);
        }
    }
    U_ASSERT(hash->count == 0);
}